

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ConditionalPredicateSyntax::ConditionalPredicateSyntax
          (ConditionalPredicateSyntax *this,
          SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *conditions)

{
  bool bVar1;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *in_RDI;
  ConditionalPatternSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *in_stack_ffffffffffffffc0;
  
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,ConditionalPredicate);
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffffc0,in_RDI);
  (in_RDI->elements)._M_ptr = (pointer)in_RDI;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)0x74199e);
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::end(in_stack_ffffffffffffffc0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffc0,
                       (iterator_base<slang::syntax::ConditionalPatternSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffc0 =
         (SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
                      *)0x7419dd);
    *(SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> **)
     &(in_stack_ffffffffffffffc0->super_SyntaxListBase).super_SyntaxNode = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
                *)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

ConditionalPredicateSyntax(const SeparatedSyntaxList<ConditionalPatternSyntax>& conditions) :
        SyntaxNode(SyntaxKind::ConditionalPredicate), conditions(conditions) {
        this->conditions.parent = this;
        for (auto child : this->conditions)
            child->parent = this;
    }